

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrioExecution.h
# Opt level: O3

void nrg::PrioExecution::push<std::function<void()>>(Queue *queue,function<void_()> *fn)

{
  uint uVar1;
  undefined8 local_60;
  undefined8 uStack_58;
  code *local_50;
  _Invoker_type p_Stack_48;
  QueueElement local_40;
  
  uVar1 = next()::nxt;
  next()::nxt = next()::nxt + 1;
  local_60 = 0;
  uStack_58 = 0;
  local_40.what._M_invoker = fn->_M_invoker;
  local_40.what.super__Function_base._M_manager = (fn->super__Function_base)._M_manager;
  if (local_40.what.super__Function_base._M_manager == (_Manager_type)0x0) {
    local_40.what.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_40.what.super__Function_base._M_functor._8_8_ = 0;
    local_40.what.super__Function_base._M_manager = (_Manager_type)0x0;
    p_Stack_48 = local_40.what._M_invoker;
  }
  else {
    local_60 = *(undefined8 *)&(fn->super__Function_base)._M_functor;
    uStack_58 = *(undefined8 *)((long)&(fn->super__Function_base)._M_functor + 8);
    (fn->super__Function_base)._M_manager = (_Manager_type)0x0;
    fn->_M_invoker = (_Invoker_type)0x0;
    local_40.what.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(fn->super__Function_base)._M_functor;
    local_40.what.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)((long)&(fn->super__Function_base)._M_functor + 8);
    p_Stack_48 = (_Invoker_type)0x0;
  }
  local_40._0_8_ = (ulong)uVar1 << 0x20;
  local_50 = (code *)0x0;
  std::vector<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>::
  emplace_back<nrg::PrioExecution::QueueElement>(&queue->c,&local_40);
  std::
  push_heap<__gnu_cxx::__normal_iterator<nrg::PrioExecution::QueueElement*,std::vector<nrg::PrioExecution::QueueElement,std::allocator<nrg::PrioExecution::QueueElement>>>,std::greater<nrg::PrioExecution::QueueElement>>
            ((queue->c).
             super__Vector_base<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (queue->c).
             super__Vector_base<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (local_40.what.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_40.what.super__Function_base._M_manager)
              ((_Any_data *)&local_40.what,(_Any_data *)&local_40.what,__destroy_functor);
  }
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,3);
  }
  return;
}

Assistant:

static void push(Queue& queue, FN fn)
    {
        QueueElement elem = { 0, next(), std::move(fn) };
        push(queue, std::move(elem));
    }